

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecal.cpp
# Opt level: O0

int32_t icu_63::CECalendar::ceToJD(int32_t year,int32_t month,int32_t date,int32_t jdEpochOffset)

{
  int iVar1;
  int32_t iVar2;
  int32_t jdEpochOffset_local;
  int32_t date_local;
  int32_t month_local;
  int32_t year_local;
  
  if (month < 0) {
    iVar1 = (month + 1) / 0xd + -1;
    jdEpochOffset_local = (month + 1) % 0xd + 0xc;
  }
  else {
    iVar1 = month / 0xd;
    jdEpochOffset_local = month % 0xd;
  }
  date_local = iVar1 + year;
  iVar2 = ClockMath::floorDivide(date_local,4);
  return jdEpochOffset + date_local * 0x16d + iVar2 + jdEpochOffset_local * 0x1e + date + -1;
}

Assistant:

int32_t
CECalendar::ceToJD(int32_t year, int32_t month, int32_t date, int32_t jdEpochOffset)
{
    // handle month > 12, < 0 (e.g. from add/set)
    if ( month >= 0 ) {
        year += month/13;
        month %= 13;
    } else {
        ++month;
        year += month/13 - 1;
        month = month%13 + 12;
    }
    return (int32_t) (
        jdEpochOffset                   // difference from Julian epoch to 1,1,1
        + 365 * year                    // number of days from years
        + ClockMath::floorDivide(year, 4)    // extra day of leap year
        + 30 * month                    // number of days from months (months are 0-based)
        + date - 1                      // number of days for present month (1 based)
        );
}